

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_229b2::verifyLevelsAreEqual
               (DeepImageLevel *level1,DeepImageLevel *level2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  _Base_ptr __n;
  undefined8 *puVar4;
  long lVar5;
  DeepImageChannel *pDVar6;
  DeepImageChannel *pDVar7;
  ImageLevel *pIVar8;
  _func_int **pp_Var9;
  bool bVar10;
  int iVar11;
  int iVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  const_iterator cVar15;
  ConstIterator CVar16;
  ostream *poVar17;
  ImageChannel *pIVar18;
  ImageChannel *pIVar19;
  DeepImageLevel *pDVar20;
  DeepImageLevel *pDVar21;
  ArgExc *this;
  ulong uVar22;
  char *text;
  int iVar23;
  int iVar24;
  
  if (((((level1->super_ImageLevel)._dataWindow.min.x ==
         (level2->super_ImageLevel)._dataWindow.min.x - dx) &&
       ((level1->super_ImageLevel)._dataWindow.min.y ==
        (level2->super_ImageLevel)._dataWindow.min.y - dy)) &&
      ((level1->super_ImageLevel)._dataWindow.max.x ==
       (level2->super_ImageLevel)._dataWindow.max.x - dx)) &&
     ((level1->super_ImageLevel)._dataWindow.max.y ==
      (level2->super_ImageLevel)._dataWindow.max.y - dy)) {
    cVar13._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level1);
    cVar14._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level2);
    cVar15._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::end(level1);
    if (cVar13._M_node != cVar15._M_node) {
      do {
        CVar16 = Imf_2_5::DeepImageLevel::end(level2);
        if ((const_iterator)cVar14._M_node == CVar16._i._M_node) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"            channel ",0x14);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)(cVar13._M_node + 1),
                             (long)cVar13._M_node[1]._M_parent);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        __n = cVar13._M_node[1]._M_parent;
        if ((__n != cVar14._M_node[1]._M_parent) ||
           ((__n != (_Base_ptr)0x0 &&
            (iVar11 = bcmp(*(void **)(cVar13._M_node + 1),*(void **)(cVar14._M_node + 1),(size_t)__n
                          ), iVar11 != 0)))) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          text = "different channel names";
          goto LAB_0011c58b;
        }
        iVar11 = (**(code **)**(undefined8 **)(cVar13._M_node + 2))();
        iVar12 = (**(code **)**(undefined8 **)(cVar14._M_node + 2))();
        if (iVar11 != iVar12) {
LAB_0011c5bf:
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          text = "different channel types";
          goto LAB_0011c58b;
        }
        puVar4 = *(undefined8 **)(cVar13._M_node + 2);
        lVar5 = *(long *)(cVar14._M_node + 2);
        if ((*(int *)(puVar4 + 2) != *(int *)(lVar5 + 0x10)) ||
           (*(int *)((long)puVar4 + 0x14) != *(int *)(lVar5 + 0x14))) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          text = "different channel sampling rates";
          goto LAB_0011c58b;
        }
        if (*(char *)(puVar4 + 3) != *(char *)(lVar5 + 0x18)) goto LAB_0011c5bf;
        iVar11 = (**(code **)*puVar4)();
        if (iVar11 == 0) {
          pDVar6 = *(DeepImageChannel **)(cVar13._M_node + 2);
          pDVar7 = *(DeepImageChannel **)(cVar14._M_node + 2);
          pIVar18 = (ImageChannel *)
                    __dynamic_cast(pDVar6,&Imf_2_5::DeepImageChannel::typeinfo,
                                   &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
          if ((pIVar18 == (ImageChannel *)0x0) ||
             (pIVar19 = (ImageChannel *)
                        __dynamic_cast(pDVar7,&Imf_2_5::DeepImageChannel::typeinfo,
                                       &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0),
             pIVar19 == (ImageChannel *)0x0)) {
LAB_0011c601:
            __cxa_bad_cast();
          }
          pIVar8 = (pDVar6->super_ImageChannel)._level;
          pDVar20 = Imf_2_5::DeepImageChannel::deepLevel(pDVar6);
          pDVar21 = Imf_2_5::DeepImageChannel::deepLevel(pDVar7);
          iVar11 = (pIVar8->_dataWindow).min.y;
          iVar12 = (pIVar8->_dataWindow).max.y;
          if (iVar11 <= iVar12) {
            iVar24 = (pIVar8->_dataWindow).max.x;
            do {
              iVar23 = (pIVar8->_dataWindow).min.x;
              if (iVar23 <= iVar24) {
                iVar12 = dy + iVar11;
                do {
                  Imf_2_5::ImageChannel::boundsCheck
                            (&(pDVar20->_sampleCounts).super_ImageChannel,iVar23,iVar11);
                  uVar3 = (pDVar20->_sampleCounts)._base
                          [(pDVar20->_sampleCounts).super_ImageChannel._pixelsPerRow * iVar11 +
                           iVar23];
                  iVar24 = iVar23 + dx;
                  Imf_2_5::ImageChannel::boundsCheck
                            (&(pDVar21->_sampleCounts).super_ImageChannel,iVar24,iVar12);
                  if (uVar3 != (pDVar21->_sampleCounts)._base
                               [(pDVar21->_sampleCounts).super_ImageChannel._pixelsPerRow * iVar12 +
                                iVar24]) goto LAB_0011c5a9;
                  Imf_2_5::ImageChannel::boundsCheck(pIVar18,iVar23,iVar11);
                  pp_Var9 = (&(pIVar18[1]._level)->_vptr_ImageLevel)
                            [pIVar18->_pixelsPerRow * iVar11 + iVar23];
                  Imf_2_5::ImageChannel::boundsCheck(pIVar19,iVar24,iVar12);
                  if (0 < (int)uVar3) {
                    uVar22 = 0;
                    do {
                      if (*(int *)((long)pp_Var9 + uVar22 * 4) !=
                          *(int *)((long)(&(pIVar19[1]._level)->_vptr_ImageLevel)
                                         [pIVar19->_pixelsPerRow * iVar12 + iVar24] + uVar22 * 4))
                      goto LAB_0011c577;
                      uVar22 = uVar22 + 1;
                    } while (uVar3 != uVar22);
                  }
                  iVar24 = (pIVar8->_dataWindow).max.x;
                  bVar10 = iVar23 < iVar24;
                  iVar23 = iVar23 + 1;
                } while (bVar10);
                iVar12 = (pIVar8->_dataWindow).max.y;
              }
              bVar10 = iVar11 < iVar12;
              iVar11 = iVar11 + 1;
            } while (bVar10);
          }
        }
        else if (iVar11 == 2) {
          pDVar6 = *(DeepImageChannel **)(cVar13._M_node + 2);
          pDVar7 = *(DeepImageChannel **)(cVar14._M_node + 2);
          pIVar18 = (ImageChannel *)
                    __dynamic_cast(pDVar6,&Imf_2_5::DeepImageChannel::typeinfo,
                                   &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0);
          if ((pIVar18 == (ImageChannel *)0x0) ||
             (pIVar19 = (ImageChannel *)
                        __dynamic_cast(pDVar7,&Imf_2_5::DeepImageChannel::typeinfo,
                                       &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0),
             pIVar19 == (ImageChannel *)0x0)) goto LAB_0011c601;
          pIVar8 = (pDVar6->super_ImageChannel)._level;
          pDVar20 = Imf_2_5::DeepImageChannel::deepLevel(pDVar6);
          pDVar21 = Imf_2_5::DeepImageChannel::deepLevel(pDVar7);
          iVar11 = (pIVar8->_dataWindow).min.y;
          iVar12 = (pIVar8->_dataWindow).max.y;
          if (iVar11 <= iVar12) {
            iVar24 = (pIVar8->_dataWindow).max.x;
            do {
              iVar23 = (pIVar8->_dataWindow).min.x;
              if (iVar23 <= iVar24) {
                iVar12 = dy + iVar11;
                do {
                  Imf_2_5::ImageChannel::boundsCheck
                            (&(pDVar20->_sampleCounts).super_ImageChannel,iVar23,iVar11);
                  uVar3 = (pDVar20->_sampleCounts)._base
                          [(pDVar20->_sampleCounts).super_ImageChannel._pixelsPerRow * iVar11 +
                           iVar23];
                  iVar24 = iVar23 + dx;
                  Imf_2_5::ImageChannel::boundsCheck
                            (&(pDVar21->_sampleCounts).super_ImageChannel,iVar24,iVar12);
                  if (uVar3 != (pDVar21->_sampleCounts)._base
                               [(pDVar21->_sampleCounts).super_ImageChannel._pixelsPerRow * iVar12 +
                                iVar24]) goto LAB_0011c5a9;
                  Imf_2_5::ImageChannel::boundsCheck(pIVar18,iVar23,iVar11);
                  pp_Var9 = (&(pIVar18[1]._level)->_vptr_ImageLevel)
                            [pIVar18->_pixelsPerRow * iVar11 + iVar23];
                  Imf_2_5::ImageChannel::boundsCheck(pIVar19,iVar24,iVar12);
                  if (0 < (int)uVar3) {
                    uVar22 = 0;
                    do {
                      fVar2 = *(float *)((long)pp_Var9 + uVar22 * 4);
                      pfVar1 = (float *)((long)(&(pIVar19[1]._level)->_vptr_ImageLevel)
                                               [pIVar19->_pixelsPerRow * iVar12 + iVar24] +
                                        uVar22 * 4);
                      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_0011c577;
                      uVar22 = uVar22 + 1;
                    } while (uVar3 != uVar22);
                  }
                  iVar24 = (pIVar8->_dataWindow).max.x;
                  bVar10 = iVar23 < iVar24;
                  iVar23 = iVar23 + 1;
                } while (bVar10);
                iVar12 = (pIVar8->_dataWindow).max.y;
              }
              bVar10 = iVar11 < iVar12;
              iVar11 = iVar11 + 1;
            } while (bVar10);
          }
        }
        else {
          if (iVar11 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                          ,0x9b,
                          "void (anonymous namespace)::verifyLevelsAreEqual(const DeepImageLevel &, const DeepImageLevel &, int, int)"
                         );
          }
          verifyPixelsAreEqual<half>
                    (*(DeepImageChannel **)(cVar13._M_node + 2),
                     *(DeepImageChannel **)(cVar14._M_node + 2),dx,dy);
        }
        cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
        cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
        CVar16 = Imf_2_5::DeepImageLevel::end(level1);
      } while ((const_iterator)cVar13._M_node != CVar16._i._M_node);
    }
    CVar16 = Imf_2_5::DeepImageLevel::end(level1);
    if (((const_iterator)cVar13._M_node == CVar16._i._M_node) &&
       (CVar16 = Imf_2_5::DeepImageLevel::end(level2),
       (const_iterator)cVar14._M_node == CVar16._i._M_node)) {
      return;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    text = "different channel lists";
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    text = "different data windows";
  }
LAB_0011c58b:
  Iex_2_5::ArgExc::ArgExc(this,text);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
LAB_0011c5a9:
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  text = "different pixel sample counts";
  goto LAB_0011c58b;
LAB_0011c577:
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  text = "different sample values";
  goto LAB_0011c58b;
}

Assistant:

void
verifyLevelsAreEqual
    (const DeepImageLevel &level1,
     const DeepImageLevel &level2,
     int dx,
     int dy)
{
    if (level1.dataWindow().min.x != level2.dataWindow().min.x - dx ||
        level1.dataWindow().min.y != level2.dataWindow().min.y - dy ||
        level1.dataWindow().max.x != level2.dataWindow().max.x - dx ||
        level1.dataWindow().max.y != level2.dataWindow().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    DeepImageLevel::ConstIterator i1 = level1.begin();
    DeepImageLevel::ConstIterator i2 = level2.begin();

    while (i1 != level1.end() && i2 != level2.end())
    {
        cout << "            channel " << i1.name() << endl;

        if (i1.name() != i2.name())
            throw ArgExc ("different channel names");

        if (i1.channel().pixelType() != i2.channel().pixelType())
            throw ArgExc ("different channel types");

        if (i1.channel().xSampling() != i2.channel().xSampling() ||
            i1.channel().ySampling() != i2.channel().ySampling())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel().pLinear() != i2.channel().pLinear())
            throw ArgExc ("different channel types");

        switch (i1.channel().pixelType())
        {
          case HALF:

            verifyPixelsAreEqual <half>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          case FLOAT:

            verifyPixelsAreEqual <float>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          case UINT:

            verifyPixelsAreEqual <unsigned int>
                (i1.channel(), i2.channel(), dx, dy);

            break;

          default:
             assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end() || i2 != level2.end())
        throw ArgExc ("different channel lists");
}